

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void Curl_expire(Curl_easy *data,timediff_t milli,expire_id id)

{
  Curl_llist *list;
  curltime *pcVar1;
  int iVar2;
  Curl_multi *pCVar3;
  Curl_llist_element *pCVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  time_node *ptVar11;
  int iVar12;
  uint uVar13;
  size_t sVar14;
  timediff_t tVar15;
  Curl_tree *pCVar16;
  Curl_llist_element *e;
  time_node *ne;
  long lVar17;
  curltime cVar18;
  curltime i;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  curltime older_01;
  
  pCVar3 = data->multi;
  if (pCVar3 != (Curl_multi *)0x0) {
    cVar18 = Curl_now();
    iVar12 = ((int)milli + (int)(milli / 1000) * -1000) * 1000;
    iVar2 = cVar18.tv_usec + iVar12;
    iVar12 = cVar18.tv_usec + -1000000 + iVar12;
    if (iVar2 < 1000000) {
      iVar12 = iVar2;
    }
    lVar17 = (ulong)(999999 < iVar2) + cVar18.tv_sec + milli / 1000;
    multi_deltimeout(data,id);
    list = &(data->state).timeoutlist;
    ne = (data->state).expires + id;
    (data->state).expires[id].time.tv_sec = lVar17;
    (data->state).expires[id].time.tv_usec = iVar12;
    (data->state).expires[id].eid = id;
    sVar14 = Curl_llist_count(list);
    if (((sVar14 == 0) || (pCVar4 = list->head, pCVar4 == (Curl_llist_element *)0x0)) ||
       (ptVar11 = (data->state).expires + id, uVar5 = (ptVar11->time).tv_sec,
       uVar6 = (ptVar11->time).tv_usec, older.tv_usec = uVar6, older.tv_sec = uVar5,
       cVar18._12_4_ = 0, cVar18._0_12_ = *(undefined1 (*) [12])((long)pCVar4->ptr + 0x18),
       older._12_4_ = 0, tVar15 = Curl_timediff(cVar18,older), 0 < tVar15)) {
      e = (Curl_llist_element *)0x0;
    }
    else {
      do {
        e = pCVar4;
        pCVar4 = e->next;
        if (pCVar4 == (Curl_llist_element *)0x0) break;
        ptVar11 = (data->state).expires + id;
        uVar7 = (ptVar11->time).tv_sec;
        uVar8 = (ptVar11->time).tv_usec;
        older_00.tv_usec = uVar8;
        older_00.tv_sec = uVar7;
        newer._12_4_ = 0;
        newer._0_12_ = *(undefined1 (*) [12])((long)pCVar4->ptr + 0x18);
        older_00._12_4_ = 0;
        tVar15 = Curl_timediff(newer,older_00);
      } while (tVar15 < 1);
    }
    Curl_llist_insert_next(list,e,ne,&ne->list);
    pcVar1 = &(data->state).expiretime;
    uVar9 = pcVar1->tv_sec;
    uVar10 = pcVar1->tv_usec;
    older_01.tv_usec = uVar10;
    older_01.tv_sec = uVar9;
    if (pcVar1->tv_sec != 0 || (data->state).expiretime.tv_usec != 0) {
      newer_00.tv_usec = iVar12;
      newer_00.tv_sec = lVar17;
      newer_00._12_4_ = 0;
      older_01._12_4_ = 0;
      tVar15 = Curl_timediff(newer_00,older_01);
      if (0 < tVar15) {
        return;
      }
      uVar13 = Curl_splayremovebyaddr(pCVar3->timetree,&(data->state).timenode,&pCVar3->timetree);
      if (uVar13 != 0) {
        Curl_infof(data,"Internal error removing splay node = %d\n",(ulong)uVar13);
      }
    }
    (data->state).expiretime.tv_sec = lVar17;
    (data->state).expiretime.tv_usec = iVar12;
    (data->state).timenode.payload = data;
    i.tv_usec = iVar12;
    i.tv_sec = lVar17;
    i._12_4_ = 0;
    pCVar16 = Curl_splayinsert(i,pCVar3->timetree,&(data->state).timenode);
    pCVar3->timetree = pCVar16;
  }
  return;
}

Assistant:

void Curl_expire(struct Curl_easy *data, timediff_t milli, expire_id id)
{
  struct Curl_multi *multi = data->multi;
  struct curltime *nowp = &data->state.expiretime;
  struct curltime set;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  DEBUGASSERT(id < EXPIRE_LAST);

  set = Curl_now();
  set.tv_sec += (time_t)(milli/1000); /* might be a 64 to 32 bit conversion */
  set.tv_usec += (unsigned int)(milli%1000)*1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  /* Remove any timer with the same id just in case. */
  multi_deltimeout(data, id);

  /* Add it to the timer list.  It must stay in the list until it has expired
     in case we need to recompute the minimum timer later. */
  multi_addtimeout(data, &set, id);

  if(nowp->tv_sec || nowp->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
       is. */
    timediff_t diff = Curl_timediff(set, *nowp);
    int rc;

    if(diff > 0) {
      /* The current splay tree entry is sooner than this new expiry time.
         We don't need to update our splay tree entry. */
      return;
    }

    /* Since this is an updated time, we must remove the previous entry from
       the splay tree first and then re-add the new value */
    rc = Curl_splayremovebyaddr(multi->timetree,
                                &data->state.timenode,
                                &multi->timetree);
    if(rc)
      infof(data, "Internal error removing splay node = %d\n", rc);
  }

  /* Indicate that we are in the splay tree and insert the new timer expiry
     value since it is our local minimum. */
  *nowp = set;
  data->state.timenode.payload = data;
  multi->timetree = Curl_splayinsert(*nowp, multi->timetree,
                                     &data->state.timenode);
}